

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int model;
  UndoHistory history;
  Cmd cmd4;
  Cmd cmd3;
  Cmd cmd2;
  Cmd cmd1;
  uint local_a4 [2];
  bool local_99;
  UndoHistory local_98;
  UndoCommand local_70;
  uint *local_68;
  undefined8 local_60;
  UndoCommand local_58;
  uint *local_50;
  undefined8 local_48;
  UndoCommand local_40;
  uint *local_38;
  undefined8 local_30;
  UndoCommand local_28;
  uint *local_20;
  undefined8 local_18;
  
  local_68 = local_a4 + 1;
  local_a4[1] = 0;
  local_28._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_18 = 1;
  local_40._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_30 = 0x100000002;
  local_58._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_48 = 0x100000003;
  local_70._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  local_60 = 0x300000004;
  local_50 = local_68;
  local_38 = local_68;
  local_20 = local_68;
  undo::UndoHistory::UndoHistory(&local_98,(UndoHistoryDelegate *)0x0);
  *local_20 = (uint)local_18;
  undo::UndoHistory::add(&local_98,&local_28);
  *local_38 = (uint)local_30;
  undo::UndoHistory::add(&local_98,&local_40);
  undo::UndoHistory::undo(&local_98);
  *local_50 = (uint)local_48;
  undo::UndoHistory::add(&local_98,&local_58);
  *local_68 = (uint)local_60;
  undo::UndoHistory::add(&local_98,&local_70);
  local_a4[0] = 4;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x20);
  undo::UndoHistory::undo(&local_98);
  local_a4[0] = 3;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x22);
  undo::UndoHistory::undo(&local_98);
  local_a4[0] = 2;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x24);
  undo::UndoHistory::undo(&local_98);
  local_a4[0] = 1;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x26);
  undo::UndoHistory::undo(&local_98);
  local_a4[0] = 0;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x28);
  local_a4[0] = local_a4[0] & 0xffffff00;
  local_99 = undo::UndoHistory::canUndo(&local_98);
  expect_eq<bool,bool>
            ((bool *)local_a4,&local_99,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x29);
  undo::UndoHistory::redo(&local_98);
  local_a4[0] = 1;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2b);
  undo::UndoHistory::redo(&local_98);
  local_a4[0] = 2;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2d);
  undo::UndoHistory::redo(&local_98);
  local_a4[0] = 3;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2f);
  undo::UndoHistory::redo(&local_98);
  local_a4[0] = 4;
  expect_eq<int,int>((int *)local_a4,(int *)(local_a4 + 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x31);
  local_a4[0] = local_a4[0] & 0xffffff00;
  local_99 = undo::UndoHistory::canRedo(&local_98);
  expect_eq<bool,bool>
            ((bool *)local_a4,&local_99,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x32);
  undo::UndoHistory::~UndoHistory(&local_98);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2
  // |
  //  ------- 3 --- 4
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 1);
  Cmd cmd4(model, 4, 3);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  history.undo();
  cmd3.redo(); history.add(&cmd3); // Creates a branch in the history
  cmd4.redo(); history.add(&cmd4);

  EXPECT_EQ(4, model);
  history.undo();
  EXPECT_EQ(3, model);
  history.undo();
  EXPECT_EQ(2, model);
  history.undo();
  EXPECT_EQ(1, model);
  history.undo();
  EXPECT_EQ(0,  model);
  EXPECT_FALSE(history.canUndo());
  history.redo();
  EXPECT_EQ(1, model);
  history.redo();
  EXPECT_EQ(2, model);
  history.redo();
  EXPECT_EQ(3, model);
  history.redo();
  EXPECT_EQ(4,  model);
  EXPECT_FALSE(history.canRedo());
}